

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging_tests.c
# Opt level: O2

void failure_reported_and_exception_thrown_when_messaging_would_block(void)

{
  undefined4 uVar1;
  undefined8 uVar2;
  long lVar3;
  char cVar4;
  char panic_message [1000];
  
  uVar1 = start_cgreen_messaging(0x21);
  signal_received = '\0';
  __sysv_signal(0xd,catch_signal);
  panic_set_output_buffer(panic_message);
  for (lVar3 = 0; (int)lVar3 != 0x10001; lVar3 = lVar3 + 1) {
    send_cgreen_message(uVar1,99);
    cVar4 = '\x01';
    if (signal_received != '\0') goto LAB_001143f7;
  }
  lVar3 = 0x10001;
  cVar4 = signal_received;
LAB_001143f7:
  uVar2 = create_equal_to_value_constraint(1,"1");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
               ,0x3c,"signal_received",cVar4,uVar2);
  uVar2 = create_less_than_value_constraint(0x10001,"LOOPS");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
               ,0x3d,"loop",lVar3,uVar2);
  uVar2 = create_contains_string_constraint("Too many assertions","\"Too many assertions\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
               ,0x3e,"panic_message",panic_message,uVar2);
  return;
}

Assistant:

Ensure(failure_reported_and_exception_thrown_when_messaging_would_block) {
    const int LOOPS = 65537;
    int messaging = start_cgreen_messaging(33);
    int loop;
    char panic_message[1000];

    signal_received = 0;
    signal(SIGPIPE, catch_signal);

    panic_set_output_buffer(panic_message);

    for (loop = 0; loop < LOOPS; loop++) {
        send_cgreen_message(messaging, 99);
        if (signal_received == 1)
            break;
    }

    assert_that(signal_received, is_equal_to(1));
    assert_that(loop, is_less_than(LOOPS));
    assert_that(panic_message, contains_string("Too many assertions"));
}